

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_helpers.c
# Opt level: O1

int kvtree_unpack_uint32_t(void *buf,size_t buf_size,size_t *buf_pos,uint32_t *val)

{
  ulong uVar1;
  uint uVar2;
  undefined8 uVar3;
  char *fmt;
  
  if ((buf_pos == (size_t *)0x0 || buf == (void *)0x0) || val == (uint32_t *)0x0) {
    fmt = "NULL pointer to buffer, buffer position, or value @ %s:%d";
    uVar3 = 0xfb;
  }
  else {
    uVar1 = *buf_pos + 4;
    if (uVar1 <= buf_size) {
      uVar2 = *(uint *)((long)buf + *buf_pos);
      *val = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      *buf_pos = uVar1;
      return 0;
    }
    fmt = "Attempting to unpack too many bytes into buffer @ %s:%d";
    uVar3 = 0x109;
  }
  kvtree_err(fmt,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_helpers.c"
             ,uVar3);
  return 1;
}

Assistant:

int kvtree_unpack_uint32_t(const void* buf, size_t buf_size, size_t* buf_pos, uint32_t* val)
{
  /* check that we have a valid pointer to a buffer position value */
  if (buf == NULL || buf_pos == NULL || val == NULL) {
    kvtree_err("NULL pointer to buffer, buffer position, or value @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* get current buffer position */
  size_t pos = *buf_pos;

  /* compute final buffer position */
  size_t pos_final = pos + sizeof(uint32_t);

  /* check that we won't overrun the buffer */
  if (pos_final > buf_size) {
    kvtree_err("Attempting to unpack too many bytes into buffer @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* read value from buffer (stored in network order) */
  uint32_t val_network;
  memcpy(&val_network, buf + pos, sizeof(val_network));

  /* conver to host order */
  *val = kvtree_ntoh32(val_network);

  /* update position */
  *buf_pos = pos_final;

  return KVTREE_SUCCESS;
}